

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void resolveP2Values(Vdbe *p,int *pMaxFuncArgs)

{
  Parse *pPVar1;
  int *piVar2;
  Op *pOVar3;
  int *piVar4;
  uint uVar5;
  
  uVar5 = *pMaxFuncArgs;
  pPVar1 = p->pParse;
  piVar2 = pPVar1->aLabel;
  p->field_0xc6 = p->field_0xc6 & 0x3f | 0x40;
  pOVar3 = p->aOp + p->nOp;
LAB_0017a6a3:
  piVar4 = &pOVar3[-1].p2;
  do {
    if (((Op *)(piVar4 + -2))->opcode < 0x41) {
      switch(((Op *)(piVar4 + -2))->opcode) {
      case '\x02':
        if (*piVar4 != 0) {
          p->field_0xc6 = p->field_0xc6 & 0xbf;
        }
      case '\0':
      case '\x01':
        p->field_0xc6 = p->field_0xc6 | 0x80;
        break;
      case '\x03':
      case '\x04':
      case '\x05':
        p->field_0xc6 = p->field_0xc6 & 0x3f | 0x80;
        break;
      case '\x06':
        if ((int)uVar5 < piVar4[-7]) {
          uVar5 = piVar4[-7];
        }
        goto switchD_0017a6be_default;
      case '\a':
        if ((int)uVar5 < *piVar4) {
          uVar5 = *piVar4;
        }
        goto LAB_0017a70f;
      case '\b':
        if (piVar2 != (int *)0x0) {
          sqlite3DbNNFreeNN(p->db,pPVar1->aLabel);
          pPVar1->aLabel = (int *)0x0;
        }
        pPVar1->nLabel = 0;
        *pMaxFuncArgs = uVar5;
        return;
      default:
        goto switchD_0017a6be_default;
      }
    }
    piVar4 = piVar4 + -6;
  } while( true );
switchD_0017a6be_default:
  if (*piVar4 < 0) {
    *piVar4 = piVar2[(uint)~*piVar4];
  }
LAB_0017a70f:
  pOVar3 = (Op *)(piVar4 + -2);
  goto LAB_0017a6a3;
}

Assistant:

static void resolveP2Values(Vdbe *p, int *pMaxFuncArgs){
  int nMaxArgs = *pMaxFuncArgs;
  Op *pOp;
  Parse *pParse = p->pParse;
  int *aLabel = pParse->aLabel;
  p->readOnly = 1;
  p->bIsReader = 0;
  pOp = &p->aOp[p->nOp-1];
  assert( p->aOp[0].opcode==OP_Init );
  while( 1 /* Loop termates when it reaches the OP_Init opcode */ ){
    /* Only JUMP opcodes and the short list of special opcodes in the switch
    ** below need to be considered.  The mkopcodeh.tcl generator script groups
    ** all these opcodes together near the front of the opcode list.  Skip
    ** any opcode that does not need processing by virtual of the fact that
    ** it is larger than SQLITE_MX_JUMP_OPCODE, as a performance optimization.
    */
    if( pOp->opcode<=SQLITE_MX_JUMP_OPCODE ){
      /* NOTE: Be sure to update mkopcodeh.tcl when adding or removing
      ** cases from this switch! */
      switch( pOp->opcode ){
        case OP_Transaction: {
          if( pOp->p2!=0 ) p->readOnly = 0;
          /* no break */ deliberate_fall_through
        }
        case OP_AutoCommit:
        case OP_Savepoint: {
          p->bIsReader = 1;
          break;
        }
#ifndef SQLITE_OMIT_WAL
        case OP_Checkpoint:
#endif
        case OP_Vacuum:
        case OP_JournalMode: {
          p->readOnly = 0;
          p->bIsReader = 1;
          break;
        }
        case OP_Init: {
          assert( pOp->p2>=0 );
          goto resolve_p2_values_loop_exit;
        }
#ifndef SQLITE_OMIT_VIRTUALTABLE
        case OP_VUpdate: {
          if( pOp->p2>nMaxArgs ) nMaxArgs = pOp->p2;
          break;
        }
        case OP_VFilter: {
          int n;
          assert( (pOp - p->aOp) >= 3 );
          assert( pOp[-1].opcode==OP_Integer );
          n = pOp[-1].p1;
          if( n>nMaxArgs ) nMaxArgs = n;
          /* Fall through into the default case */
          /* no break */ deliberate_fall_through
        }
#endif
        default: {
          if( pOp->p2<0 ){
            /* The mkopcodeh.tcl script has so arranged things that the only
            ** non-jump opcodes less than SQLITE_MX_JUMP_CODE are guaranteed to
            ** have non-negative values for P2. */
            assert( (sqlite3OpcodeProperty[pOp->opcode] & OPFLG_JUMP)!=0 );
            assert( ADDR(pOp->p2)<-pParse->nLabel );
            pOp->p2 = aLabel[ADDR(pOp->p2)];
          }
          break;
        }
      }
      /* The mkopcodeh.tcl script has so arranged things that the only
      ** non-jump opcodes less than SQLITE_MX_JUMP_CODE are guaranteed to
      ** have non-negative values for P2. */
      assert( (sqlite3OpcodeProperty[pOp->opcode]&OPFLG_JUMP)==0 || pOp->p2>=0);
    }
    assert( pOp>p->aOp );
    pOp--;
  }
resolve_p2_values_loop_exit:
  if( aLabel ){
    sqlite3DbNNFreeNN(p->db, pParse->aLabel);
    pParse->aLabel = 0;
  }
  pParse->nLabel = 0;
  *pMaxFuncArgs = nMaxArgs;
  assert( p->bIsReader!=0 || DbMaskAllZero(p->btreeMask) );
}